

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputRemark(Node *this,ostream *os)

{
  byte bVar1;
  pointer pcVar2;
  char cVar3;
  ostream *poVar4;
  byte *pbVar5;
  char *pcVar6;
  long lVar7;
  string Remark;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  pcVar2 = (this->TextValue)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->TextValue)._M_string_length);
  cVar3 = (char)*local_70;
  if (cVar3 == '!') {
    std::__cxx11::string::erase((ulong)&local_70,0);
    cVar3 = (char)*local_70;
  }
  if (cVar3 == ' ') {
    std::__cxx11::string::erase((ulong)&local_70,0);
  }
  lVar7 = 2;
  pcVar6 = "//";
  if (local_68 != 0) {
    do {
      pbVar5 = (byte *)((long)local_70 + local_68 + -1);
      bVar1 = *pbVar5;
      if (bVar1 < 0x20) {
        if (bVar1 == 9) {
          std::__cxx11::string::_M_erase((ulong)&local_70,(long)pbVar5 - (long)local_70);
        }
        else {
          if ((bVar1 != 10) && (bVar1 != 0xd)) {
LAB_0011d3f8:
            if (((char)*local_70 != '\t') && ((char)*local_70 != '*')) {
              lVar7 = 3;
              pcVar6 = "// ";
            }
            break;
          }
          std::__cxx11::string::_M_erase((ulong)&local_70,(long)pbVar5 - (long)local_70);
        }
      }
      else if (bVar1 == 0x20) {
        std::__cxx11::string::_M_erase((ulong)&local_70,(long)pbVar5 - (long)local_70);
      }
      else if (bVar1 == 0x21) {
        std::__cxx11::string::_M_erase((ulong)&local_70,(long)pbVar5 - (long)local_70);
      }
      else {
        if (bVar1 != 0x26) goto LAB_0011d3f8;
        std::__cxx11::string::_M_erase((ulong)&local_70,(long)pbVar5 - (long)local_70);
      }
    } while (local_68 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
  if (this->Tree[0] != (Node *)0x0) {
    local_50._M_dataplus._M_p._0_1_ = 0x20;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
    Expression_abi_cxx11_(&local_50,this->Tree[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                       local_50._M_dataplus._M_p._0_1_),local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                      local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void Node::OutputRemark(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	std::string Remark = TextValue;

	//
	// Skip start of remark character
	//
	if (Remark[0] == '!')
	{
#ifdef STLREMOVE
		Remark.remove(0,1);
#else
		Remark.erase(0,1);
#endif
	}

	//
	// Skip extra white space
	//
	if (Remark[0] == ' ')
	{
#ifdef STLREMOVE
		Remark.remove(0,1);
#else
		Remark.erase(0,1);
#endif
	}

	//
	// Lose any junk at end of comment
	// (Yes, it does modify the original value)
	//
	while(Remark.length() > 0)
	{
		// Line continuation marker
		if (*(Remark.end() - 1) == '&')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// New Line
		if ((*(Remark.end() - 1) == '\n') ||
			(*(Remark.end() - 1) == '\r'))
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Space
		if (*(Remark.end() - 1) == ' ')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Tab
		if (*(Remark.end() - 1) == '\t')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Exclimation point
		if (*(Remark.end() - 1) == '!')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Break out of loop
		break;
	}

	//
	// Dump out remark (and maybe add a space to the front)
	//
	if ((Remark.length() == 0) || (Remark[0] == '\t') || (Remark[0] == '*'))
	{
		os << "//" << Remark;
	}
	else
	{
		os << "// " << Remark;
	}

	//
	// There may be some extra stuff that needs printing
	//
	if (Tree[0] != 0)
	{
		os << ' ' << Tree[0]->Expression();
	}

	os << std::endl;

}